

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

bool __thiscall kratos::Generator::is_auxiliary_var(Generator *this,shared_ptr<kratos::Var> *var)

{
  iterator iVar1;
  mapped_type *pmVar2;
  bool bVar3;
  key_type local_20;
  key_type local_1c;
  
  local_20 = (*(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               super_IRNode)._vptr_IRNode[7])();
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->auxiliary_vars_)._M_h,&local_20);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    bVar3 = false;
  }
  else {
    local_1c = (*(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 super_IRNode)._vptr_IRNode[7])();
    pmVar2 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->auxiliary_vars_,&local_1c);
    bVar3 = (pmVar2->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
            (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  return bVar3;
}

Assistant:

bool Generator::is_auxiliary_var(const std::shared_ptr<Var> &var) {
    return auxiliary_vars_.find(var->width()) != auxiliary_vars_.end() &&
           auxiliary_vars_.at(var->width()) == var;
}